

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int nn_node_check_prefix(nn_trie_node *self,uint8_t *data,size_t size)

{
  int i;
  size_t size_local;
  uint8_t *data_local;
  nn_trie_node *self_local;
  
  i = 0;
  size_local = size;
  data_local = data;
  while( true ) {
    if (i == (uint)self->prefix_len) {
      return (uint)self->prefix_len;
    }
    if ((size_local == 0) || (self->prefix[i] != *data_local)) break;
    data_local = data_local + 1;
    size_local = size_local - 1;
    i = i + 1;
  }
  return i;
}

Assistant:

int nn_node_check_prefix (struct nn_trie_node *self,
    const uint8_t *data, size_t size)
{
    /*  Check how many characters from the data match the prefix. */

    int i;

    for (i = 0; i != self->prefix_len; ++i) {
        if (!size || self->prefix [i] != *data)
            return i;
        ++data;
        --size;
    }
    return self->prefix_len;
}